

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O0

void test_archive_string_conversion(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a_00;
  FILE *__stream;
  size_t __n;
  size_t v2;
  FILE_conflict *fp;
  ssize_t size;
  char buff [512];
  archive_entry *ae;
  archive *a;
  
  extract_reference_file("test_archive_string_conversion.txt.Z");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͣ',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͤ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_raw((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,"test_archive_string_conversion.txt.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͧ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile, 512)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)(buff + 0x1f8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  __stream = fopen("testdata.txt","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͪ',(uint)(__stream != (FILE *)0x0),"(fp = fopen(testdata, \"w\")) != NULL",
                   (void *)0x0);
  while( true ) {
    __n = archive_read_data((archive *)a_00,&size,0x200);
    if ((long)__n < 1) break;
    v2 = fwrite(&size,1,__n,__stream);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,L'ͬ',__n,"size",v2,"fwrite(buff, 1, size, fp)",(void *)0x0);
  }
  iVar1 = fclose(__stream);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͭ',0,"0",(long)iVar1,"fclose(fp)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͮ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  test_archive_string_normalization_nfc("testdata.txt");
  test_archive_string_normalization_mac_nfd("testdata.txt");
  test_archive_string_canonicalization();
  test_archive_string_set_get();
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		assertEqualInt(size, fwrite(buff, 1, size, fp));
	assertEqualInt(0, fclose(fp));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
	test_archive_string_set_get();
}